

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildInt2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  RegOpnd *this_00;
  RegOpnd *this_01;
  Instr *pIVar4;
  RegOpnd *src1Opnd;
  undefined4 *puVar5;
  IntConstOpnd *src2Opnd;
  Func *pFVar6;
  IRType type;
  undefined6 in_register_00000032;
  OpCode OVar7;
  IntConstType value;
  int iVar8;
  
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyInt32);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,VVar3);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyInt32);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_01->super_Opnd,VVar3);
  iVar8 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (0x72 < iVar8) {
    if (iVar8 < 0xbb) {
      if (iVar8 == 0x73) {
        pFVar6 = this->m_func;
        OVar7 = PopCnt;
      }
      else {
        if (iVar8 == 0x9b) goto switchD_004f9d18_caseD_62;
        if (iVar8 != 0xb7) goto LAB_004f9dea;
        pFVar6 = this->m_func;
        OVar7 = InlineMathAbs;
      }
    }
    else if (iVar8 == 0xbb) {
      pFVar6 = this->m_func;
      OVar7 = InlineMathClz;
    }
    else {
      if (iVar8 != 0xbc) {
        if (iVar8 == 0x10a) {
          src1Opnd = BuildSrcOpnd(this,3,TyVar);
          pIVar4 = IR::Instr::New(GrowWasmMemory,&this_01->super_Opnd,&src1Opnd->super_Opnd,
                                  &this_00->super_Opnd,this->m_func);
          AddInstr(this,pIVar4,offset);
          goto LAB_004f9e5c;
        }
        goto LAB_004f9dea;
      }
      pFVar6 = this->m_func;
      OVar7 = Ctz;
    }
    goto LAB_004f9ebd;
  }
  if (iVar8 < 0x48) {
    if (iVar8 != 10) {
      if (iVar8 != 0x29) {
        if (iVar8 == 0x47) {
          pIVar4 = IR::Instr::New(Ld_I4,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
          CheckJitLoopReturn(this,dstRegSlot,TyInt32);
          goto LAB_004f9ef9;
        }
LAB_004f9dea:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x9c9,"((0))","(0)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
        AddInstr(this,(Instr *)0x0,offset);
        if (newOpcode != GrowMemory) {
          return;
        }
LAB_004f9e5c:
        BuildHeapBufferReload(this,offset,false);
        return;
      }
      SwitchIRBuilder::BeginSwitch(&this->m_switchBuilder);
    }
    pFVar6 = this->m_func;
    OVar7 = Ld_I4;
    goto LAB_004f9ebd;
  }
  switch(iVar8) {
  case 0x60:
    pFVar6 = this->m_func;
    OVar7 = Neg_I4;
    goto LAB_004f9ebd;
  case 0x61:
    pFVar6 = this->m_func;
    OVar7 = Not_I4;
LAB_004f9ebd:
    pIVar4 = IR::Instr::New(OVar7,&this_01->super_Opnd,&this_00->super_Opnd,pFVar6);
    goto LAB_004f9ef9;
  case 0x62:
switchD_004f9d18_caseD_62:
    src2Opnd = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
    pFVar6 = this->m_func;
    OVar7 = CmEq_I4;
    break;
  case 99:
    src2Opnd = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
    pFVar6 = this->m_func;
    OVar7 = CmNeq_I4;
    break;
  default:
    if (iVar8 == 0x48) {
      pFVar6 = this->m_func;
      value = 1;
      type = TyInt8;
    }
    else {
      if (iVar8 != 0x49) goto LAB_004f9dea;
      pFVar6 = this->m_func;
      value = 2;
      type = TyInt16;
    }
    src2Opnd = IR::IntConstOpnd::New(value,type,pFVar6,false);
    pFVar6 = this->m_func;
    OVar7 = Conv_Prim;
  }
  pIVar4 = IR::Instr::New(OVar7,&this_01->super_Opnd,&this_00->super_Opnd,&src2Opnd->super_Opnd,
                          pFVar6);
LAB_004f9ef9:
  AddInstr(this,pIVar4,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt2(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt32);
    srcOpnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::BeginSwitch_Int:
        m_switchBuilder.BeginSwitch();
        // fall-through
    case Js::OpCodeAsmJs::Ld_Int:
        instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Neg_Int:
        instr = IR::Instr::New(Js::OpCode::Neg_I4, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Not_Int:
        instr = IR::Instr::New(Js::OpCode::Not_I4, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::LogNot_Int:
        instr = IR::Instr::New(Js::OpCode::CmEq_I4, dstOpnd, srcOpnd, IR::IntConstOpnd::New(0, TyInt32, m_func), m_func);
        break;

    case Js::OpCodeAsmJs::Conv_ITB:
        instr = IR::Instr::New(Js::OpCode::CmNeq_I4, dstOpnd, srcOpnd, IR::IntConstOpnd::New(0, TyInt32, m_func), m_func);
        break;

    case Js::OpCodeAsmJs::Abs_Int:
        instr = IR::Instr::New(Js::OpCode::InlineMathAbs, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Clz32_Int:
        instr = IR::Instr::New(Js::OpCode::InlineMathClz, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Ctz_Int:
        instr = IR::Instr::New(Js::OpCode::Ctz, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::PopCnt_Int:
        instr = IR::Instr::New(Js::OpCode::PopCnt, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Return_Int:
        instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, srcOpnd, m_func);
        CheckJitLoopReturn(dstRegSlot, TyInt32);
        break;

    case Js::OpCodeAsmJs::Eqz_Int:
        instr = IR::Instr::New(Js::OpCode::CmEq_I4, dstOpnd, srcOpnd, IR::IntConstOpnd::New(0, TyInt32, m_func), m_func);
        break;

    case Js::OpCodeAsmJs::GrowMemory:
        instr = IR::Instr::New(Js::OpCode::GrowWasmMemory, dstOpnd, BuildSrcOpnd(AsmJsRegSlots::WasmMemoryReg, TyVar), srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::I32Extend8_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt8);
        break;
    case Js::OpCodeAsmJs::I32Extend16_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt16);
        break;
    default:
        Assume(UNREACHED);
    }

    AddInstr(instr, offset);

    if (newOpcode == Js::OpCodeAsmJs::GrowMemory)
    {
        BuildHeapBufferReload(offset);
    }
}